

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyraytracer.cpp
# Opt level: O0

bool scene_intersect(Vec3f *orig,Vec3f *dir,vector<Sphere,_std::allocator<Sphere>_> *spheres,
                    Vec3f *hit,Vec3f *N,Material *material)

{
  vec<3UL,_float> lhs;
  float fVar1;
  Vec3f *this;
  bool bVar2;
  reference __src;
  vec<3UL,_float> *pvVar3;
  float *pfVar4;
  vec<3UL,_float> vVar5;
  vec<3UL,_float> vVar6;
  vec<3UL,_float> local_1a0;
  vec<3UL,_float> local_194;
  vec<3UL,_float> local_188;
  undefined8 local_178;
  float local_170;
  vec<3UL,_float> local_168;
  vec<3UL,_float> local_158;
  undefined8 local_148;
  float local_140;
  undefined8 local_13c;
  Vec3f pt;
  float d;
  float checkerboard_dist;
  float local_120;
  vec<3UL,_float> local_fc;
  vec<3UL,_float> local_f0;
  undefined8 local_e0;
  float local_d8;
  vec<3UL,_float> local_d0;
  vec<3UL,_float> local_c0;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_a0;
  float local_98;
  float local_90;
  undefined1 local_8c [4];
  float dist_i;
  Sphere sphere;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Sphere,_std::allocator<Sphere>_> *__range1;
  Material *pMStack_38;
  float spheres_dist;
  Material *material_local;
  Vec3f *N_local;
  Vec3f *hit_local;
  vector<Sphere,_std::allocator<Sphere>_> *spheres_local;
  Vec3f *dir_local;
  Vec3f *orig_local;
  
  pMStack_38 = material;
  material_local = (Material *)N;
  N_local = hit;
  hit_local = (Vec3f *)spheres;
  spheres_local = (vector<Sphere,_std::allocator<Sphere>_> *)dir;
  dir_local = orig;
  __range1._4_4_ = std::numeric_limits<float>::max();
  this = hit_local;
  __end1 = std::vector<Sphere,_std::allocator<Sphere>_>::begin
                     ((vector<Sphere,_std::allocator<Sphere>_> *)hit_local);
  sphere.material._28_8_ =
       std::vector<Sphere,_std::allocator<Sphere>_>::end
                 ((vector<Sphere,_std::allocator<Sphere>_> *)this);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>
                                     *)&sphere.material.diffuse_color.z), bVar2) {
    __src = __gnu_cxx::
            __normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>::
            operator*(&__end1);
    memcpy(local_8c,__src,0x34);
    bVar2 = Sphere::ray_intersect((Sphere *)local_8c,dir_local,(Vec3f *)spheres_local,&local_90);
    if ((bVar2) && (local_90 < __range1._4_4_)) {
      __range1._4_4_ = local_90;
      local_a8 = dir_local->z;
      local_b0._0_4_ = dir_local->x;
      local_b0._4_4_ = dir_local->y;
      vVar6 = operator*((vec<3UL,_float> *)spheres_local,&local_90);
      local_d0.z = vVar6.z;
      local_c0.z = local_d0.z;
      local_d0._0_8_ = vVar6._0_8_;
      local_c0.x = local_d0.x;
      local_c0.y = local_d0.y;
      local_d8 = local_a8;
      local_e0 = local_b0;
      vVar5.z = local_a8;
      vVar5.x = (float)(undefined4)local_b0;
      vVar5.y = (float)local_b0._4_4_;
      local_d0 = vVar6;
      vVar6 = operator+(vVar5,&local_c0);
      local_f0.z = vVar6.z;
      local_98 = local_f0.z;
      local_f0._0_8_ = vVar6._0_8_;
      local_a0._0_4_ = local_f0.x;
      local_a0._4_4_ = local_f0.y;
      N_local->z = local_f0.z;
      N_local->x = local_f0.x;
      N_local->y = local_f0.y;
      lhs.x = N_local->x;
      lhs.y = N_local->y;
      lhs.z = N_local->z;
      local_f0 = vVar6;
      vVar6 = operator-(lhs,(vec<3UL,_float> *)local_8c);
      _d = vVar6._0_8_;
      local_fc.x = d;
      local_fc.y = checkerboard_dist;
      local_120 = vVar6.z;
      local_fc.z = local_120;
      pvVar3 = vec<3UL,_float>::normalize(&local_fc,1.0);
      fVar1 = pvVar3->y;
      material_local->refractive_index = pvVar3->x;
      (material_local->albedo).x = fVar1;
      (material_local->albedo).y = pvVar3->z;
      memcpy(pMStack_38,&sphere.center.z,0x24);
    }
    __gnu_cxx::__normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>::
    operator++(&__end1);
  }
  pt.z = std::numeric_limits<float>::max();
  vVar6 = local_188;
  if (0.001 < ABS(*(float *)((long)&(spheres_local->
                                    super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
                                    super__Vector_impl_data._M_start + 4))) {
    pt.y = -(dir_local->y + 4.0) /
           *(float *)((long)&(spheres_local->super__Vector_base<Sphere,_std::allocator<Sphere>_>).
                             _M_impl.super__Vector_impl_data._M_start + 4);
    local_140 = dir_local->z;
    local_148._0_4_ = dir_local->x;
    local_148._4_4_ = dir_local->y;
    vVar5 = operator*((vec<3UL,_float> *)spheres_local,&pt.y);
    local_168.z = vVar5.z;
    local_158.z = local_168.z;
    local_168._0_8_ = vVar5._0_8_;
    local_158.x = local_168.x;
    local_158.y = local_168.y;
    local_170 = local_140;
    local_178 = local_148;
    vVar6.z = local_140;
    vVar6.x = (float)(undefined4)local_148;
    vVar6.y = (float)local_148._4_4_;
    local_168 = vVar5;
    vVar6 = operator+(vVar6,&local_158);
    local_188._0_8_ = vVar6._0_8_;
    local_13c._0_4_ = local_188.x;
    local_13c._4_4_ = local_188.y;
    local_188.z = vVar6.z;
    pt.x = local_188.z;
    if ((((0.0 < pt.y) && (local_13c._0_4_ = vVar6.x, fVar1 = ABS((float)local_13c), fVar1 < 10.0))
        && (local_188.z < -10.0)) && ((-30.0 < local_188.z && (pt.y < __range1._4_4_)))) {
      pt.z = pt.y;
      N_local->x = local_188.x;
      N_local->y = local_188.y;
      N_local->z = local_188.z;
      local_188 = vVar6;
      vec<3UL,_float>::vec(&local_194,0.0,1.0,0.0);
      material_local->refractive_index = local_194.x;
      (material_local->albedo).x = local_194.y;
      (material_local->albedo).y = local_194.z;
      if (((int)(N_local->x * 0.5 + 1000.0) + (int)(N_local->z * 0.5) & 1U) == 0) {
        vec<3UL,_float>::vec(&local_1a0,0.3,0.2,0.1);
      }
      else {
        vec<3UL,_float>::vec(&local_1a0,0.3,0.3,0.3);
      }
      (pMStack_38->diffuse_color).x = local_1a0.x;
      (pMStack_38->diffuse_color).y = local_1a0.y;
      (pMStack_38->diffuse_color).z = local_1a0.z;
      vVar6 = local_188;
    }
  }
  local_188 = vVar6;
  pfVar4 = std::min<float>((float *)((long)&__range1 + 4),&pt.z);
  return *pfVar4 < 1000.0;
}

Assistant:

bool scene_intersect(Vec3f const& orig, Vec3f const& dir,
                     std::vector<Sphere> const& spheres, Vec3f& hit, Vec3f& N,
                     Material& material)
{
  auto spheres_dist = std::numeric_limits<float>::max();
  for (auto sphere : spheres)
  {
    float dist_i;
    if (sphere.ray_intersect(orig, dir, dist_i) && dist_i < spheres_dist)
    {
      spheres_dist = dist_i;
      hit          = orig + dir * dist_i;
      N            = (hit - sphere.center).normalize();
      material     = sphere.material;
    }
  }

  float checkerboard_dist = std::numeric_limits<float>::max();
  if (fabs(dir.y) > 1e-3f)
  {
    float d  = -(orig.y + 4) / dir.y;  // Checkerboard plane is y = -4
    Vec3f pt = orig + dir * d;
    if (d > 0 && fabs(pt.x) < 10 && pt.z < -10 && pt.z > -30 &&
        d < spheres_dist)
    {
      checkerboard_dist = d;
      hit               = pt;
      N                 = Vec3f(0, 1, 0);
      material.diffuse_color =
          (int(.5f * hit.x + 1000) + int(.5f * hit.z)) & 1  // NOLINT
              ? Vec3f(.3f, .3f, .3f)
              : Vec3f(.3f, .2f, .1f);
    }
  }
  return std::min(spheres_dist, checkerboard_dist) < 1000;
}